

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

TokenType __thiscall Json::Reader::readNumber(Reader *this)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *ret;
  TokenType type;
  Reader *this_local;
  
  ret._4_4_ = tokenInteger;
  if (this->current_ != this->end_) {
    if (*this->current_ == '-') {
      this->current_ = this->current_ + 1;
    }
    while (this->current_ != this->end_) {
      iVar1 = isdigit((int)*this->current_);
      if (iVar1 == 0) {
        pcVar2 = std::begin<char_const,5ul>((char (*) [5])".eE+-");
        pcVar3 = std::end<char_const,5ul>((char (*) [5])".eE+-");
        pcVar2 = std::find<char_const*,char>(pcVar2,pcVar3,this->current_);
        pcVar3 = std::end<char_const,5ul>((char (*) [5])".eE+-");
        if (pcVar2 == pcVar3) {
          return ret._4_4_;
        }
        ret._4_4_ = tokenDouble;
      }
      this->current_ = this->current_ + 1;
    }
  }
  return ret._4_4_;
}

Assistant:

Reader::TokenType
Reader::readNumber ()
{
    static char const extended_tokens[] = { '.', 'e', 'E', '+', '-' };

    TokenType type = tokenInteger;

    if ( current_ != end_ )
    {
        if (*current_ == '-')
            ++current_;

        while ( current_ != end_ )
        {
            if (!std::isdigit (*current_))
            {
                auto ret = std::find (std::begin (extended_tokens),
                    std::end (extended_tokens), *current_);

                if (ret == std::end (extended_tokens))
                    break;

                type = tokenDouble;
            }

            ++current_;
        }
    }

    return type;
}